

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O0

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::construct_bfs
          (DynamicPartialIndex *this,vertex_t s,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *graph,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  value_type vVar1;
  uint uVar2;
  uint uVar3;
  size_type sVar4;
  bool bVar5;
  reference pvVar6;
  reference pvVar7;
  byte *pbVar8;
  const_reference this_00;
  reference puVar9;
  uint *nxt;
  const_iterator __end2;
  const_iterator __begin2;
  value_type *__range2;
  value_type cur;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *dist_local;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *graph_local;
  vertex_t s_local;
  DynamicPartialIndex *this_local;
  
  this->back_ = 0;
  this->front_ = 0;
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)s);
  *pvVar6 = '\0';
  sVar4 = this->back_;
  this->back_ = sVar4 + 1;
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this->queue_,sVar4);
  *pvVar7 = s;
  while (this->back_ != this->front_) {
    sVar4 = this->front_;
    this->front_ = sVar4 + 1;
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this->queue_,sVar4);
    uVar2 = *pvVar7;
    pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)uVar2);
    if (*pbVar8 < this->k_) {
      this_00 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::at(graph,(ulong)uVar2);
      __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_00);
      nxt = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                         *)&nxt), bVar5) {
        puVar9 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end2);
        pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar9)
        ;
        if (*pvVar6 == '?') {
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)uVar2)
          ;
          vVar1 = *pvVar6;
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             (dist,(ulong)*puVar9);
          *pvVar6 = vVar1 + '\x01';
          if (((this->isD2_ & 1U) == 0) || (bVar5 = indexed(&this->parent_->D1_,*puVar9), !bVar5)) {
            uVar3 = *puVar9;
            sVar4 = this->back_;
            this->back_ = sVar4 + 1;
            pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                               (this->queue_,sVar4);
            *pvVar7 = uVar3;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end2);
      }
    }
  }
  return;
}

Assistant:

void
DynamicScalableKReach::DynamicPartialIndex::construct_bfs(vertex_t s, const std::vector<std::vector<vertex_t>> &graph,
                                                          std::vector<distance_t> &dist) {
    back_ = 0;
    front_ = 0;
    dist.at(s) = 0;
    queue_.at(back_++) = s;
    while (back_ != front_) {
        auto cur = queue_.at(front_++);
        if (dist.at(cur) >= k_) {
            continue;
        }
        for (const auto &nxt : graph.at(cur)) {
            if (dist.at(nxt) != INF8) {
                continue;
            }
            dist.at(nxt) = dist.at(cur) + 1;
            if (!isD2_ || !parent_.D1_.indexed(nxt)) {
                queue_.at(back_++) = nxt;
            }
        }
    }
}